

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_> * __thiscall
wallet::LegacyScriptPubKeyMan::MarkUnusedAddresses
          (vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>
           *__return_storage_ptr__,LegacyScriptPubKeyMan *this,CScript *script)

{
  undefined4 uVar1;
  CKeyID seed_id;
  void *pvVar2;
  pointer pCVar3;
  bool bVar4;
  int iVar5;
  iterator iVar6;
  iterator iVar7;
  uchar *puVar8;
  pointer __k;
  pointer pCVar9;
  long *plVar10;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock5;
  CKeyMetadata meta;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_> local_138;
  vector<CKeyID,_std::allocator<CKeyID>_> local_120;
  unique_lock<std::recursive_mutex> local_108;
  undefined1 local_f8 [16];
  string local_e8;
  undefined8 local_c8 [2];
  undefined1 local_b8;
  undefined1 uStack_b7;
  undefined1 uStack_b6;
  undefined1 uStack_b5;
  uchar local_b4 [4];
  _Rb_tree_color local_b0;
  _Storage<bool,_true> local_a8;
  bool bStack_a7;
  undefined6 uStack_a6;
  long local_98;
  bool local_90 [8];
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_108._M_device =
       &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore.super_recursive_mutex
  ;
  local_108._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_108);
  (__return_storage_ptr__->
  super__Vector_base<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetAffectedKeys(&local_120,script,
                  &(this->super_LegacyDataSPKM).super_FillableSigningProvider.super_SigningProvider)
  ;
  if (local_120.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_120.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    __k = local_120.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
          super__Vector_impl_data._M_start;
    do {
      iVar6 = std::
              _Rb_tree<CKeyID,_std::pair<const_CKeyID,_long>,_std::_Select1st<std::pair<const_CKeyID,_long>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
              ::find(&(this->super_LegacyDataSPKM).m_pool_key_to_index._M_t,__k);
      if ((_Rb_tree_header *)iVar6._M_node !=
          &(this->super_LegacyDataSPKM).m_pool_key_to_index._M_t._M_impl.super__Rb_tree_header) {
        ScriptPubKeyMan::WalletLogPrintf<char[20]>
                  ((ScriptPubKeyMan *)this,(ConstevalFormatString<1U>)0x4a265b,
                   (char (*) [20])"MarkUnusedAddresses");
        MarkReserveKeysAsUsed(&local_138,this,(int64_t)iVar6._M_node[1]._M_right);
        pCVar3 = local_138.super__Vector_base<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        plVar10 = (long *)wallet::LEGACY_OUTPUT_TYPES._16_8_;
        for (pCVar9 = local_138.
                      super__Vector_base<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            wallet::LEGACY_OUTPUT_TYPES._16_8_ = plVar10, pCVar9 != pCVar3; pCVar9 = pCVar9 + 1) {
          if (plVar10 != (long *)0x0) {
            do {
              GetDestinationForKey
                        ((CTxDestination *)&local_88._M_first,&pCVar9->vchPubKey,
                         *(OutputType *)(plVar10 + 1));
              std::__detail::__variant::
              _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              ::_Copy_ctor_base((_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                 *)local_f8,
                                (_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                 *)&local_88._M_first);
              local_a8 = (_Storage<bool,_true>)pCVar9->fInternal;
              bStack_a7 = true;
              std::vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>::
              emplace_back<wallet::WalletDestination>
                        (__return_storage_ptr__,(WalletDestination *)local_f8);
              std::__detail::__variant::
              _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                   *)local_f8);
              std::__detail::__variant::
              _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                   *)&local_88._M_first);
              plVar10 = (long *)*plVar10;
            } while (plVar10 != (long *)0x0);
          }
          plVar10 = (long *)wallet::LEGACY_OUTPUT_TYPES._16_8_;
        }
        if (local_138.super__Vector_base<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_138.
                          super__Vector_base<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_138.
                                super__Vector_base<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_138.
                                super__Vector_base<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        iVar5 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[9])
                          (this,0);
        if ((char)iVar5 == '\0') {
          ScriptPubKeyMan::WalletLogPrintf<char[20]>
                    ((ScriptPubKeyMan *)this,(ConstevalFormatString<1U>)0x4a26be,
                     (char (*) [20])"MarkUnusedAddresses");
        }
      }
      iVar7 = std::
              _Rb_tree<CKeyID,_std::pair<const_CKeyID,_wallet::CKeyMetadata>,_std::_Select1st<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
              ::find(&(this->super_LegacyDataSPKM).mapKeyMetadata._M_t,__k);
      if ((_Rb_tree_header *)iVar7._M_node !=
          &(this->super_LegacyDataSPKM).mapKeyMetadata._M_t._M_impl.super__Rb_tree_header) {
        local_f8._0_8_ = iVar7._M_node[1]._M_right;
        local_f8._8_8_ = *(undefined8 *)(iVar7._M_node + 2);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_f8 + 0x10),iVar7._M_node[2]._M_parent,
                   (long)&(iVar7._M_node[2]._M_left)->_M_color + (long)iVar7._M_node[2]._M_parent);
        _local_b8 = *(undefined4 *)&iVar7._M_node[3]._M_right;
        local_c8[0] = iVar7._M_node[3]._M_parent;
        local_c8[1] = iVar7._M_node[3]._M_left;
        local_b0 = iVar7._M_node[4]._M_color;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &iVar7._M_node[4]._M_parent);
        local_90[0] = SUB41(iVar7._M_node[5]._M_color,0);
        puVar8 = std::
                 __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<160u>::IsNull()const::_lambda(unsigned_char)_1_>>
                           (local_c8,local_b4);
        if (puVar8 != local_b4) {
          uVar1 = *(undefined4 *)
                   ((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                    super_base_blob<160U>.m_data._M_elems + 0x10);
          auVar11[0] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                         super_base_blob<160U>.m_data._M_elems[0] == (undefined1)local_c8[0]);
          auVar11[1] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                         super_base_blob<160U>.m_data._M_elems[1] == local_c8[0]._1_1_);
          auVar11[2] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                         super_base_blob<160U>.m_data._M_elems[2] == local_c8[0]._2_1_);
          auVar11[3] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                         super_base_blob<160U>.m_data._M_elems[3] == local_c8[0]._3_1_);
          auVar11[4] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                         super_base_blob<160U>.m_data._M_elems[4] == local_c8[0]._4_1_);
          auVar11[5] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                         super_base_blob<160U>.m_data._M_elems[5] == local_c8[0]._5_1_);
          auVar11[6] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                         super_base_blob<160U>.m_data._M_elems[6] == local_c8[0]._6_1_);
          auVar11[7] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                         super_base_blob<160U>.m_data._M_elems[7] == local_c8[0]._7_1_);
          auVar11[8] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                         super_base_blob<160U>.m_data._M_elems[8] == (undefined1)local_c8[1]);
          auVar11[9] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                         super_base_blob<160U>.m_data._M_elems[9] == local_c8[1]._1_1_);
          auVar11[10] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                          super_base_blob<160U>.m_data._M_elems[10] == local_c8[1]._2_1_);
          auVar11[0xb] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                           super_base_blob<160U>.m_data._M_elems[0xb] == local_c8[1]._3_1_);
          auVar11[0xc] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                           super_base_blob<160U>.m_data._M_elems[0xc] == local_c8[1]._4_1_);
          auVar11[0xd] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                           super_base_blob<160U>.m_data._M_elems[0xd] == local_c8[1]._5_1_);
          auVar11[0xe] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                           super_base_blob<160U>.m_data._M_elems[0xe] == local_c8[1]._6_1_);
          auVar11[0xf] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                           super_base_blob<160U>.m_data._M_elems[0xf] == local_c8[1]._7_1_);
          auVar12[0] = -((char)uVar1 == (char)_local_b8);
          auVar12[1] = -((char)((uint)uVar1 >> 8) == (char)((uint)_local_b8 >> 8));
          auVar12[2] = -((char)((uint)uVar1 >> 0x10) == (char)((uint)_local_b8 >> 0x10));
          auVar12[3] = -((char)((uint)uVar1 >> 0x18) == (char)((uint)_local_b8 >> 0x18));
          auVar12[4] = 0xff;
          auVar12[5] = 0xff;
          auVar12[6] = 0xff;
          auVar12[7] = 0xff;
          auVar12[8] = 0xff;
          auVar12[9] = 0xff;
          auVar12[10] = 0xff;
          auVar12[0xb] = 0xff;
          auVar12[0xc] = 0xff;
          auVar12[0xd] = 0xff;
          auVar12[0xe] = 0xff;
          auVar12[0xf] = 0xff;
          auVar11 = auVar11 & auVar12;
          if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) != 0xffff) {
            local_88._0_16_ = (undefined1  [16])0x0;
            local_88._16_8_ = 0;
            if (local_90[0] == true) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88._M_first,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8);
            }
            else {
              bVar4 = ParseHDKeypath((string *)(local_f8 + 0x10),
                                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     &local_88._M_first);
              if (!bVar4) {
                ScriptPubKeyMan::WalletLogPrintf<char[20],std::__cxx11::string>
                          ((ScriptPubKeyMan *)this,(ConstevalFormatString<2U>)0x4a26ed,
                           (char (*) [20])"MarkUnusedAddresses",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_f8 + 0x10));
              }
            }
            if (local_88._8_8_ - local_88._0_8_ == 0xc) {
              seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[8] =
                   (undefined1)local_c8[1];
              seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[9] = local_c8[1]._1_1_;
              seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[10] = local_c8[1]._2_1_;
              seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xb] = local_c8[1]._3_1_;
              seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xc] = local_c8[1]._4_1_;
              seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xd] = local_c8[1]._5_1_;
              seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xe] = local_c8[1]._6_1_;
              seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xf] = local_c8[1]._7_1_;
              seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0] =
                   (undefined1)local_c8[0];
              seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[1] = local_c8[0]._1_1_;
              seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[2] = local_c8[0]._2_1_;
              seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[3] = local_c8[0]._3_1_;
              seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[4] = local_c8[0]._4_1_;
              seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[5] = local_c8[0]._5_1_;
              seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[6] = local_c8[0]._6_1_;
              seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[7] = local_c8[0]._7_1_;
              seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x10] = local_b8;
              seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x11] = uStack_b7;
              seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x12] = uStack_b6;
              seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x13] = uStack_b5;
              bVar4 = TopUpInactiveHDChain
                                (this,seed_id,(ulong)(*(uint *)(local_88._0_8_ + 8) & 0x7fffffff),
                                 (*(uint *)(local_88._0_8_ + 4) & 0x7fffffff) != 0);
              if (!bVar4) {
                ScriptPubKeyMan::WalletLogPrintf<char[20]>
                          ((ScriptPubKeyMan *)this,(ConstevalFormatString<1U>)0x4a277b,
                           (char (*) [20])"MarkUnusedAddresses");
              }
            }
            else {
              local_138.super__Vector_base<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)((long)(local_88._8_8_ - local_88._0_8_) >> 2);
              ScriptPubKeyMan::WalletLogPrintf<char[20],unsigned_long,bool>
                        ((ScriptPubKeyMan *)this,(ConstevalFormatString<3U>)0x4a272a,
                         (char (*) [20])"MarkUnusedAddresses",(unsigned_long *)&local_138,local_90);
            }
            if ((void *)local_88._0_8_ != (void *)0x0) {
              operator_delete((void *)local_88._0_8_,local_88._16_8_ - local_88._0_8_);
            }
          }
        }
        pvVar2 = (void *)CONCAT62(uStack_a6,CONCAT11(bStack_a7,local_a8._M_value));
        if (pvVar2 != (void *)0x0) {
          operator_delete(pvVar2,local_98 - (long)pvVar2);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
      }
      __k = __k + 1;
    } while (__k != local_120.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  }
  if (local_120.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.super__Vector_impl_data.
      _M_start != (key_type *)0x0) {
    operator_delete(local_120.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_120.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<WalletDestination> LegacyScriptPubKeyMan::MarkUnusedAddresses(const CScript& script)
{
    LOCK(cs_KeyStore);
    std::vector<WalletDestination> result;
    // extract addresses and check if they match with an unused keypool key
    for (const auto& keyid : GetAffectedKeys(script, *this)) {
        std::map<CKeyID, int64_t>::const_iterator mi = m_pool_key_to_index.find(keyid);
        if (mi != m_pool_key_to_index.end()) {
            WalletLogPrintf("%s: Detected a used keypool key, mark all keypool keys up to this key as used\n", __func__);
            for (const auto& keypool : MarkReserveKeysAsUsed(mi->second)) {
                // derive all possible destinations as any of them could have been used
                for (const auto& type : LEGACY_OUTPUT_TYPES) {
                    const auto& dest = GetDestinationForKey(keypool.vchPubKey, type);
                    result.push_back({dest, keypool.fInternal});
                }
            }

            if (!TopUp()) {
                WalletLogPrintf("%s: Topping up keypool failed (locked wallet)\n", __func__);
            }
        }

        // Find the key's metadata and check if it's seed id (if it has one) is inactive, i.e. it is not the current m_hd_chain seed id.
        // If so, TopUp the inactive hd chain
        auto it = mapKeyMetadata.find(keyid);
        if (it != mapKeyMetadata.end()){
            CKeyMetadata meta = it->second;
            if (!meta.hd_seed_id.IsNull() && meta.hd_seed_id != m_hd_chain.seed_id) {
                std::vector<uint32_t> path;
                if (meta.has_key_origin) {
                    path = meta.key_origin.path;
                } else if (!ParseHDKeypath(meta.hdKeypath, path)) {
                    WalletLogPrintf("%s: Adding inactive seed keys failed, invalid hdKeypath: %s\n",
                                    __func__,
                                    meta.hdKeypath);
                }
                if (path.size() != 3) {
                    WalletLogPrintf("%s: Adding inactive seed keys failed, invalid path size: %d, has_key_origin: %s\n",
                                    __func__,
                                    path.size(),
                                    meta.has_key_origin);
                } else {
                    bool internal = (path[1] & ~BIP32_HARDENED_KEY_LIMIT) != 0;
                    int64_t index = path[2] & ~BIP32_HARDENED_KEY_LIMIT;

                    if (!TopUpInactiveHDChain(meta.hd_seed_id, index, internal)) {
                        WalletLogPrintf("%s: Adding inactive seed keys failed\n", __func__);
                    }
                }
            }
        }
    }

    return result;
}